

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_DEF(Context *ctx)

{
  uint uVar1;
  int in_ECX;
  size_t in_RDX;
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  char dst [64];
  char local_f8 [32];
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [72];
  
  get_ARB1_destarg_varname(ctx,local_78,in_RDX);
  floatstr(ctx,local_98,1,(float)ctx->dwords[0],in_ECX);
  floatstr(ctx,local_b8,1,(float)ctx->dwords[1],in_ECX);
  floatstr(ctx,local_d8,1,(float)ctx->dwords[2],in_ECX);
  floatstr(ctx,local_f8,1,(float)ctx->dwords[3],in_ECX);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = { %s, %s, %s, %s };",local_78,local_98,local_b8,local_d8,local_f8);
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(SETP)

static void emit_ARB1_DEF(Context *ctx)
{
    const float *val = (const float *) ctx->dwords; // !!! FIXME: could be int?
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    char val0[32]; floatstr(ctx, val0, sizeof (val0), val[0], 1);
    char val1[32]; floatstr(ctx, val1, sizeof (val1), val[1], 1);
    char val2[32]; floatstr(ctx, val2, sizeof (val2), val[2], 1);
    char val3[32]; floatstr(ctx, val3, sizeof (val3), val[3], 1);

    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = { %s, %s, %s, %s };",
                dst, val0, val1, val2, val3);
    pop_output(ctx);
}